

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::replaceWithLogicalBasis(HModel *this)

{
  pointer piVar1;
  pointer piVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = this->numRow;
  if (0 < iVar3) {
    piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      iVar3 = this->numCol;
      piVar2[iVar3 + lVar4] = 0;
      piVar1[lVar4] = (int)lVar4 + iVar3;
      lVar4 = lVar4 + 1;
      iVar3 = this->numRow;
    } while (lVar4 < iVar3);
  }
  if (0 < this->numCol) {
    piVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      piVar1[lVar4] = 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->numCol);
    iVar3 = this->numRow;
  }
  this->numBasicLogicals = iVar3;
  populate_WorkArrays(this);
  mlFg_Update(this,this->mlFg_action_NewBasis);
  return;
}

Assistant:

void HModel::replaceWithLogicalBasis() {
  // Replace basis with a logical basis then populate (where possible)
  // work* arrays
  for (int row = 0; row < numRow; row++) {
    int var = numCol + row;
    nonbasicFlag[var] = NONBASIC_FLAG_FALSE;
    basicIndex[row] = var;
  }
  for (int col = 0; col < numCol; col++) {
    nonbasicFlag[col] = NONBASIC_FLAG_TRUE;
  }
  numBasicLogicals = numRow;

  populate_WorkArrays();

  //Deduce the consequences of a new basis
  mlFg_Update(mlFg_action_NewBasis);
}